

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::SolveSOR
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *param_6,REAL overrelax,REAL *tol,int FromCurrent,
          int direction)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  TPZFMatrix<std::complex<long_double>_> *in_RDI;
  TPZBaseMatrix *in_R8;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar5;
  longdouble lVar6;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int64_t j;
  int64_t ic;
  complex<long_double> eqres;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  complex<long_double> res;
  complex<long_double> *pcVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffd02;
  undefined6 in_stack_fffffffffffffd12;
  int64_t in_stack_fffffffffffffd18;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffd20;
  complex<long_double> *in_stack_fffffffffffffd60;
  double local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined1 local_278 [32];
  complex<long_double> local_258 [3];
  TPZFMatrix<std::complex<long_double>_> local_1f8;
  long local_160;
  double local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  _func_int **local_138;
  complex<long_double> *local_130;
  int64_t local_128;
  int64_t local_120;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  int64_t local_e8;
  long local_e0;
  complex<long_double> local_d8;
  complex<long_double> local_b8;
  complex<long_double> local_98 [2];
  double local_58 [4];
  double local_38;
  TPZBaseMatrix *local_28;
  long *local_20;
  TPZBaseMatrix *local_18;
  long *local_10;
  
  local_38 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::complex<long_double>::complex(local_98,(longdouble)2.0,(longdouble)0);
    lVar3 = (longdouble)*in_stack_00000008;
    pcVar7 = SUB108(lVar3,0);
    uVar8 = (undefined2)((unkuint10)lVar3 >> 0x40);
    lVar4 = in_ST5;
    std::complex<long_double>::complex(&local_b8,lVar3,(longdouble)0);
    std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar8),pcVar7);
    lVar3 = (longdouble)1;
    pcVar7 = SUB108(lVar3,0);
    uVar8 = (undefined2)((unkuint10)lVar3 >> 0x40);
    std::complex<long_double>::complex(&local_d8,lVar3,(longdouble)0);
    std::operator+((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar8),pcVar7);
    lVar3 = in_ST0;
    if (local_28 != (TPZBaseMatrix *)0x0) {
      lVar3 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar4;
      ::Norm(in_RDI);
      std::complex<long_double>::operator=((complex<long_double> *)local_58,in_ST0);
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*local_20 + 0x78))();
    }
    iVar2 = (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0xc])();
    local_e0 = CONCAT44(extraout_var,iVar2);
    local_e8 = TPZBaseMatrix::Cols(local_18);
    local_f8 = 0;
    local_100 = local_e0;
    local_108 = 1;
    if (in_stack_00000018 == -1) {
      local_f8 = local_e0 + -1;
      local_100 = -1;
      local_108 = -1;
    }
    lVar4 = (longdouble)0;
    uVar8 = (undefined2)((unkuint10)lVar4 >> 0x40);
    lVar5 = in_ST5;
    lVar6 = in_ST5;
    std::complex<long_double>::complex((complex<long_double> *)&local_138,lVar4,lVar4);
    local_110 = 0;
    while( true ) {
      bVar1 = false;
      if (local_110 < *local_10) {
        local_148 = local_58[2];
        uStack_140 = local_58[3];
        local_158 = local_58[0];
        uStack_150 = local_58[1];
        uVar8 = SUB82(local_58[3],0);
        in_stack_fffffffffffffd12 = (undefined6)((ulong)local_58[3] >> 0x10);
        in_stack_fffffffffffffd02 = (undefined6)((ulong)local_58[1] >> 0x10);
        fabs(local_58[0]);
        bVar1 = ABS(*in_stack_00000008) < (double)lVar3;
        lVar3 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = lVar5;
        lVar5 = lVar6;
      }
      if (!bVar1) break;
      lVar4 = (longdouble)0;
      pcVar7 = SUB108(lVar4,0);
      uVar9 = (undefined2)((unkuint10)lVar4 >> 0x40);
      lVar6 = lVar5;
      std::complex<long_double>::operator=((complex<long_double> *)local_58,lVar4);
      for (local_160 = 0; local_160 < local_e8; local_160 = local_160 + 1) {
        for (local_f0 = local_f8; local_f0 != local_100; local_f0 = local_108 + local_f0) {
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (&local_1f8.fWork,local_18,local_f0,local_160);
          local_138 = local_1f8.fWork._vptr_TPZVec;
          local_130 = local_1f8.fWork.fStore;
          local_128 = local_1f8.fWork.fNElements;
          local_120 = local_1f8.fWork.fNAlloc;
          for (local_1f8.fPivot._48_8_ = 0; (long)local_1f8.fPivot._48_8_ < local_e0;
              local_1f8.fPivot._48_8_ = local_1f8.fPivot._48_8_ + 1) {
            (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_1f8.fElem,in_RDI,local_f0,local_1f8.fPivot._48_8_);
            TPZFMatrix<std::complex<long_double>_>::operator()
                      (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       CONCAT62(in_stack_fffffffffffffd12,uVar8));
            std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar9),pcVar7)
            ;
            std::complex<long_double>::operator-=
                      ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar9),pcVar7);
          }
          in_stack_fffffffffffffd20 = &local_1f8;
          std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar9),pcVar7);
          std::complex<long_double>::operator+=
                    ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar9),pcVar7);
          lVar4 = (longdouble)local_38;
          uVar8 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
          pcVar7 = SUB108(lVar4,0);
          uVar9 = (undefined2)((unkuint10)lVar4 >> 0x40);
          lVar5 = in_ST5;
          lVar6 = in_ST5;
          std::complex<long_double>::complex(local_258,lVar4,(longdouble)0);
          std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar9),pcVar7);
          (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x24])(local_278,in_RDI,local_f0,local_f0);
          std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar9),pcVar7);
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                     CONCAT62(in_stack_fffffffffffffd12,uVar8));
          std::complex<long_double>::operator+=
                    ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd02,uVar9),pcVar7);
        }
      }
      std::sqrt<long_double>(in_stack_fffffffffffffd60);
      local_58[0] = local_298;
      local_58[1] = (double)local_290;
      local_58[2] = (double)local_288;
      local_58[3] = (double)local_280;
      local_110 = local_110 + 1;
    }
    if (local_28 != (TPZBaseMatrix *)0x0) {
      (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x28])(in_RDI,local_20,local_18,local_28);
    }
    *local_10 = local_110;
    fabs(local_58[0]);
    *in_stack_00000008 = (double)lVar3;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}